

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O1

string * __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::variable_info_abi_cxx11_
          (string *__return_storage_ptr__,canvas_factory<(linux_util::screen_t)0> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  device::xioctl(&this->super_device,0x4600,&this->vinfo);
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\nxres\t\t",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nyres\t\t",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nxres_virtual\t",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nyres_virtual\t",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nxoffset\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nyoffset\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nbits_per_pixel\t",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nr shift\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\ng shift\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nb shift\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nt shift\t\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\ngrayscale\t",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nnonstd\t\t",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nactivate\t",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nheight\t\t",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"mm",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nwidth\t\t",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"mm\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string variable_info()  {
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // acquire variable info
            std::stringstream ss;
            ss  << "\nxres\t\t" << vinfo.xres           // visible resolution
                << "\nyres\t\t" << vinfo.yres
                << "\nxres_virtual\t" << vinfo.xres_virtual // virtual resolution
                << "\nyres_virtual\t" << vinfo.yres_virtual
                << "\nxoffset\t\t" << vinfo.xoffset     // offsets from virtual to visible resolution
                << "\nyoffset\t\t" << vinfo.yoffset
                << "\nbits_per_pixel\t" << vinfo.bits_per_pixel
                << "\nr shift\t\t" << vinfo.red.offset
                << "\ng shift\t\t" << vinfo.green.offset
                << "\nb shift\t\t" << vinfo.blue.offset
                << "\nt shift\t\t" << vinfo.transp.offset
                << "\ngrayscale\t" << vinfo.grayscale   // 0 = color, 1 = grayscale, >1 = FOURCC
                << "\nnonstd\t\t" << vinfo.nonstd       // != 0 non standard pixel format
                << "\nactivate\t" << vinfo.activate     // e.g FB_ACTIVATE_NOW set values immediately (or vbl), FB_ACTIVATE_FORCE force apply even when no change
                << "\nheight\t\t" << vinfo.height << "mm"   // height of picture in mm
                << "\nwidth\t\t" << vinfo.width << "mm\n";  // width of picture in mm
            return ss.str();
        }